

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portability_path_test.cpp
# Opt level: O0

void __thiscall
portability_path_test_portability_path_test_path_get_name_double_extension_Test::TestBody
          (portability_path_test_portability_path_test_path_get_name_double_extension_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  size_t size;
  string_name name;
  unsigned_long *in_stack_fffffffffffff710;
  unsigned_long *in_stack_fffffffffffff718;
  AssertionResult *this_00;
  undefined7 in_stack_fffffffffffff720;
  undefined1 in_stack_fffffffffffff727;
  char *in_stack_fffffffffffff728;
  AssertHelper local_8a0;
  Message local_898;
  char local_88a;
  undefined1 local_889;
  AssertionResult local_888;
  AssertHelper local_878;
  Message local_870;
  undefined8 local_868;
  long local_860;
  AssertionResult local_858;
  AssertHelper local_848;
  Message local_840 [3];
  int local_828;
  undefined4 local_824;
  AssertionResult local_820;
  long local_810;
  char local_808 [2056];
  
  local_810 = portability_path_get_name("/a/b/c/.asd.yes",0x10,local_808,0x800);
  local_824 = 0;
  local_828 = strcmp(local_808,".asd");
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffff728,
             (char *)CONCAT17(in_stack_fffffffffffff727,in_stack_fffffffffffff720),
             (int *)in_stack_fffffffffffff718,(int *)in_stack_fffffffffffff710);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_820);
  if (!bVar1) {
    testing::Message::Message(local_840);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x1174c1);
    testing::internal::AssertHelper::AssertHelper
              (&local_848,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/portability_path_test/source/portability_path_test.cpp"
               ,0xb2,pcVar2);
    testing::internal::AssertHelper::operator=(&local_848,local_840);
    testing::internal::AssertHelper::~AssertHelper(&local_848);
    testing::Message::~Message((Message *)0x11751e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x117573);
  local_860 = local_810;
  local_868 = 5;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            (in_stack_fffffffffffff728,
             (char *)CONCAT17(in_stack_fffffffffffff727,in_stack_fffffffffffff720),
             in_stack_fffffffffffff718,in_stack_fffffffffffff710);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_858);
  if (!bVar1) {
    testing::Message::Message(&local_870);
    in_stack_fffffffffffff728 =
         testing::AssertionResult::failure_message((AssertionResult *)0x117625);
    testing::internal::AssertHelper::AssertHelper
              (&local_878,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/portability_path_test/source/portability_path_test.cpp"
               ,0xb3,in_stack_fffffffffffff728);
    testing::internal::AssertHelper::operator=(&local_878,&local_870);
    testing::internal::AssertHelper::~AssertHelper(&local_878);
    testing::Message::~Message((Message *)0x117682);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1176d7);
  local_889 = 0;
  local_88a = "/a/b/c/.asd.yes"[local_810 + 0xf];
  this_00 = &local_888;
  testing::internal::EqHelper::Compare<char,_char,_nullptr>
            (in_stack_fffffffffffff728,
             (char *)CONCAT17(in_stack_fffffffffffff727,in_stack_fffffffffffff720),
             &this_00->success_,(char *)in_stack_fffffffffffff710);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!bVar1) {
    testing::Message::Message(&local_898);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x11777a);
    testing::internal::AssertHelper::AssertHelper
              (&local_8a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/portability_path_test/source/portability_path_test.cpp"
               ,0xb4,pcVar2);
    testing::internal::AssertHelper::operator=(&local_8a0,&local_898);
    testing::internal::AssertHelper::~AssertHelper(&local_8a0);
    testing::Message::~Message((Message *)0x1177c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x117814);
  return;
}

Assistant:

TEST_F(portability_path_test, portability_path_test_path_get_name_double_extension)
{
	static const char base[] = "/a/b/c/.asd.yes";
	static const char result[] = ".asd";

	string_name name;

	size_t size = portability_path_get_name(base, sizeof(base), name, NAME_SIZE);

	EXPECT_EQ((int)0, (int)strcmp(name, result));
	EXPECT_EQ((size_t)size, (size_t)sizeof(result));
	EXPECT_EQ((char)'\0', (char)result[size - 1]);
}